

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O3

void __thiscall
Js::ConcatString::ConcatString(ConcatString *this,JavascriptString *a,JavascriptString *b)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  charcount_t cVar5;
  StaticType *stringTypeStatic;
  undefined4 *puVar6;
  JavascriptString *this_00;
  JavascriptString *this_01;
  
  stringTypeStatic =
       StringCache::GetStringTypeStatic
                 (&((((a->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->stringCache);
  ConcatStringN<2>::ConcatStringN(&this->super_ConcatStringN<2>,stringTypeStatic,false);
  (this->super_ConcatStringN<2>).super_ConcatStringBase.super_LiteralString.super_JavascriptString.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)&PTR_Finalize_014f2f80;
  if (b == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x12e,"(b)","b");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  this_00 = CompoundString::GetImmutableOrScriptUnreferencedString(a);
  this_01 = CompoundString::GetImmutableOrScriptUnreferencedString(b);
  pTVar1 = (this->super_ConcatStringN<2>).m_slots;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_ConcatStringN<2>).m_slots[0].ptr = this_00;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pTVar1 = (this->super_ConcatStringN<2>).m_slots + 1;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_ConcatStringN<2>).m_slots[1].ptr = this_01;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  cVar4 = JavascriptString::GetLength(this_00);
  cVar5 = JavascriptString::GetLength(this_01);
  JavascriptString::SetLength((JavascriptString *)this,cVar4 + cVar5);
  return;
}

Assistant:

ConcatString::ConcatString(JavascriptString* a, JavascriptString* b) :
        ConcatStringN<2>(a->GetLibrary()->GetStringTypeStatic(), false)
    {
        Assert(a);
        Assert(b);

        a = CompoundString::GetImmutableOrScriptUnreferencedString(a);
        b = CompoundString::GetImmutableOrScriptUnreferencedString(b);

        m_slots[0] = a;
        m_slots[1] = b;

        this->SetLength(a->GetLength() + b->GetLength()); // does not include null character
    }